

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

int __thiscall musicBlock::OPLloadBank(musicBlock *this,FileReader *data)

{
  long local_30;
  uchar filehdr [8];
  OP2instrEntry *instruments;
  FileReader *data_local;
  musicBlock *this_local;
  
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&local_30,8);
  if (local_30 == 0x2349495f4c504f23) {
    filehdr = (uchar  [8])calloc(0xaf,0x24);
    if (filehdr == (uchar  [8])0x0) {
      this_local._4_4_ = -3;
    }
    else {
      (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,filehdr,0x189c);
      if (this->OPLinstruments != (OP2instrEntry *)0x0) {
        free(this->OPLinstruments);
      }
      this->OPLinstruments = (OP2instrEntry *)filehdr;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -2;
  }
  return this_local._4_4_;
}

Assistant:

int musicBlock::OPLloadBank (FileReader &data)
{
	static const uchar masterhdr[8] = { '#','O','P','L','_','I','I','#' };
	struct OP2instrEntry *instruments;

	uchar filehdr[8];

	data.Read (filehdr, 8);
	if (memcmp(filehdr, masterhdr, 8))
		return -2;			/* bad instrument file */
	if ( (instruments = (struct OP2instrEntry *)calloc(OP2INSTRCOUNT, OP2INSTRSIZE)) == NULL)
		return -3;			/* not enough memory */
	data.Read (instruments, OP2INSTRSIZE * OP2INSTRCOUNT);
	if (OPLinstruments != NULL)
	{
		free(OPLinstruments);
	}
	OPLinstruments = instruments;
#if 0
	for (int i = 0; i < 175; ++i)
	{
		Printf ("%3d.%-33s%3d %3d %3d %d\n", i,
			(BYTE *)data+6308+i*32,
			OPLinstruments[i].instr[0].basenote,
			OPLinstruments[i].instr[1].basenote,
			OPLinstruments[i].note,
			OPLinstruments[i].flags);
	}
#endif
	return 0;
}